

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupTrimmed2(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  Gia_ManCreateRefs(p);
  pVVar12 = p->vCos;
  iVar7 = p->nRegs;
  iVar16 = pVVar12->nSize;
  if (iVar7 < iVar16) {
    lVar13 = 0;
    do {
      if (iVar16 <= lVar13) goto LAB_001e7103;
      iVar16 = pVVar12->pArray[lVar13];
      if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_001e70c5;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar10 = pGVar3 + iVar16 + -(ulong)((uint)*(undefined8 *)(pGVar3 + iVar16) & 0x1fffffff);
      if ((pGVar10 < pGVar3) || (pGVar3 + (uint)p->nObjs <= pGVar10)) goto LAB_001e70e4;
      p->pRefs[(int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * -0x55555555] =
           p->pRefs[(int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * -0x55555555] + -1;
      lVar13 = lVar13 + 1;
      iVar7 = p->nRegs;
      iVar16 = pVVar12->nSize;
    } while (lVar13 < iVar16 - iVar7);
  }
  uVar17 = p->vCis->nSize;
  uVar14 = 0;
  uVar6 = uVar17 - iVar7;
  if (uVar6 == 0 || (int)uVar17 < iVar7) {
LAB_001e6c21:
    if ((uint)uVar14 == uVar6) goto LAB_001e6c29;
  }
  else {
    uVar18 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      uVar18 = uVar14;
    }
    do {
      if (uVar18 == uVar14) goto LAB_001e7103;
      iVar7 = p->vCis->pArray[uVar14];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001e70c5;
      if ((p->pObjs == (Gia_Obj_t *)0x0) || (p->pRefs[iVar7] != 0)) goto LAB_001e6c21;
      uVar14 = uVar14 + 1;
    } while (uVar6 != uVar14);
LAB_001e6c29:
    pGVar10 = Gia_ManAppendObj(p_00);
    uVar14 = *(ulong *)pGVar10;
    *(ulong *)pGVar10 = uVar14 | 0x9fffffff;
    *(ulong *)pGVar10 =
         uVar14 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    pGVar3 = p_00->pObjs;
    if ((pGVar10 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar10)) {
LAB_001e70e4:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * -0x55555555);
    if ((pGVar10 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar10)) goto LAB_001e70e4;
  }
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar12 = p->vCis;
  uVar14 = (ulong)(uint)pVVar12->nSize;
  if (0 < pVVar12->nSize) {
    lVar13 = 0;
    do {
      lVar15 = (long)pVVar12->pArray[lVar13];
      if ((lVar15 < 0) || (p->nObjs <= pVVar12->pArray[lVar13])) goto LAB_001e70c5;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + lVar15;
      if ((p->pRefs[lVar15] != 0) ||
         ((uVar4 = *(undefined8 *)pGVar3, ((uint)uVar4 & 0x9fffffff) == 0x9fffffff &&
          ((int)uVar14 - p->nRegs <= (int)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff))))) {
        pGVar11 = Gia_ManAppendObj(p_00);
        uVar14 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar14 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar14 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar10 = p_00->pObjs;
        if ((pGVar11 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar11)) goto LAB_001e70e4;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * -0x55555555);
        pGVar10 = p_00->pObjs;
        if ((pGVar11 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar11)) goto LAB_001e70e4;
        pGVar3->Value = (int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * 0x55555556;
        pVVar12 = p->vCis;
      }
      lVar13 = lVar13 + 1;
      uVar14 = (ulong)pVVar12->nSize;
    } while (lVar13 < (long)uVar14);
  }
  iVar7 = p->nObjs;
  if (0 < iVar7) {
    lVar15 = 8;
    lVar13 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar14 = *(ulong *)((long)pGVar3 + lVar15 + -8);
      if ((uVar14 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
        uVar17 = *(uint *)((long)pGVar3 +
                          lVar15 + (ulong)(uint)((int)(uVar14 & 0x1fffffff) << 2) * -3);
        if (((int)uVar17 < 0) ||
           (uVar6 = *(uint *)((long)pGVar3 +
                             lVar15 + (ulong)((uint)(uVar14 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar6 < 0)) goto LAB_001e7122;
        iVar7 = Gia_ManAppendAnd(p_00,uVar17 ^ (uint)(uVar14 >> 0x1d) & 1,
                                 uVar6 ^ (uint)(uVar14 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar15) = iVar7;
        iVar7 = p->nObjs;
      }
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar13 < iVar7);
  }
  iVar16 = p->nRegs;
  pVVar12 = p->vCos;
  uVar17 = pVVar12->nSize;
  uVar14 = 0;
  uVar6 = uVar17 - iVar16;
  if (uVar6 == 0 || (int)uVar17 < iVar16) {
LAB_001e6f91:
    if ((uint)uVar14 != uVar6) goto LAB_001e6fa6;
  }
  else {
    uVar18 = 0;
    if (0 < (int)uVar17) {
      uVar18 = (ulong)uVar17;
    }
    do {
      if (uVar18 == uVar14) {
LAB_001e7103:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar12->pArray[uVar14];
      if (((long)iVar1 < 0) || (iVar7 <= iVar1)) goto LAB_001e70c5;
      if ((p->pObjs == (Gia_Obj_t *)0x0) ||
         ((pGVar3 = p->pObjs + iVar1,
          uVar5 = *(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)),
          (~uVar5 & 0x1fffffff1fffffff) != 0 &&
          ((((uint)uVar5 & 0x9fffffff) != 0x9fffffff ||
           (p->vCis->nSize - iVar16 <= (int)((uint)(uVar5 >> 0x20) & 0x1fffffff)))))))
      goto LAB_001e6f91;
      uVar14 = uVar14 + 1;
    } while (uVar6 != uVar14);
  }
  Gia_ManAppendCo(p_00,0);
  pVVar12 = p->vCos;
  uVar17 = pVVar12->nSize;
LAB_001e6fa6:
  uVar14 = (ulong)uVar17;
  if (0 < (int)uVar17) {
    lVar13 = 0;
    do {
      iVar7 = pVVar12->pArray[lVar13];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_001e70c5:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar7;
      uVar18 = *(ulong *)pGVar3;
      uVar17 = (uint)uVar18 & 0x1fffffff;
      uVar5 = *(ulong *)(pGVar3 + -(ulong)uVar17);
      if ((((~uVar5 & 0x1fffffff1fffffff) != 0) &&
          ((((uint)uVar5 & 0x9fffffff) != 0x9fffffff ||
           (p->vCis->nSize - p->nRegs <= (int)((uint)(uVar5 >> 0x20) & 0x1fffffff))))) ||
         ((uVar17 != 0x1fffffff && (int)(uint)uVar18 < 0 &&
          ((int)uVar14 - p->nRegs <= (int)((uint)(uVar18 >> 0x20) & 0x1fffffff))))) {
        if ((int)pGVar3[-(ulong)uVar17].Value < 0) {
LAB_001e7122:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,pGVar3[-(ulong)uVar17].Value ^ (uint)(uVar18 >> 0x1d) & 1);
        pVVar12 = p->vCos;
      }
      lVar13 = lVar13 + 1;
      uVar14 = (ulong)pVVar12->nSize;
    } while (lVar13 < (long)uVar14);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  iVar7 = Gia_ManHasDangling(p_00);
  if (iVar7 != 0) {
    __assert_fail("!Gia_ManHasDangling( pNew )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x8f7,"Gia_Man_t *Gia_ManDupTrimmed2(Gia_Man_t *)");
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupTrimmed2( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // start new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // check if there are PIs to be added
    Gia_ManCreateRefs( p );
    // discount references of POs
    Gia_ManForEachPo( p, pObj, i )
        Gia_ObjRefFanin0Dec( p, pObj );
    // check if PIs are left
    Gia_ManForEachPi( p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) )
            break;
    if ( i == Gia_ManPiNum(p) ) // there is no PIs - add dummy PI
        Gia_ManAppendCi(pNew);
    // add the ROs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) || Gia_ObjIsRo(p, pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // check if there are POs to be added
    Gia_ManForEachPo( p, pObj, i )
        if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) && !Gia_ObjIsPi(p, Gia_ObjFanin0(pObj)) )
            break;
    if ( i == Gia_ManPoNum(p) ) // there is no POs - add dummy PO
        Gia_ManAppendCo( pNew, 0 );
    Gia_ManForEachCo( p, pObj, i )
        if ( (!Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) && !Gia_ObjIsPi(p, Gia_ObjFanin0(pObj))) || Gia_ObjIsRi(p, pObj) )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( !Gia_ManHasDangling( pNew ) );
    return pNew;
}